

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomLayout::read(DomLayout *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator o;
  size_t sVar4;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DomLayoutItem *v_2;
  DomProperty *v_1;
  DomProperty *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_fffffffffffffbe8;
  DomProperty *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  byte in_stack_fffffffffffffbff;
  DomProperty *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc08;
  byte in_stack_fffffffffffffc0f;
  DomProperty *in_stack_fffffffffffffc10;
  uint in_stack_fffffffffffffc18;
  const_iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffbf0);
  o = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffbf0);
  while (bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,o), bVar1) {
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1ada85);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
               (size_t)in_stack_fffffffffffffc00);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffffc00,
               (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
    bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffbf0,
                         (QStringView *)in_stack_fffffffffffffbe8);
    QString::~QString((QString *)0x1adae9);
    if (bVar1) {
      QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1adafd);
      QStringView::toString((QStringView *)in_stack_fffffffffffffbf0);
      setAttributeClass((DomLayout *)in_stack_fffffffffffffbf0,
                        &in_stack_fffffffffffffbe8->m_attr_name);
      QString::~QString((QString *)0x1adb41);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                 (size_t)in_stack_fffffffffffffc00);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffc00,
                 (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffbf0,
                           (QStringView *)in_stack_fffffffffffffbe8);
      QString::~QString((QString *)0x1adb9a);
      if (bVar1) {
        QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1adbae);
        QStringView::toString((QStringView *)in_stack_fffffffffffffbf0);
        setAttributeName((DomLayout *)in_stack_fffffffffffffbf0,
                         &in_stack_fffffffffffffbe8->m_attr_name);
        QString::~QString((QString *)0x1adbf2);
      }
      else {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                   (size_t)in_stack_fffffffffffffc00);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffc00,
                   (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffbf0,
                             (QStringView *)in_stack_fffffffffffffbe8);
        QString::~QString((QString *)0x1adc4b);
        if (bVar1) {
          QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1adc5f);
          QStringView::toString((QStringView *)in_stack_fffffffffffffbf0);
          setAttributeStretch((DomLayout *)in_stack_fffffffffffffbf0,
                              &in_stack_fffffffffffffbe8->m_attr_name);
          QString::~QString((QString *)0x1adca3);
        }
        else {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                     (size_t)in_stack_fffffffffffffc00);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffffc00,
                     (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffbf0,
                               (QStringView *)in_stack_fffffffffffffbe8);
          QString::~QString((QString *)0x1adcfc);
          if (bVar1) {
            QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1add10);
            QStringView::toString((QStringView *)in_stack_fffffffffffffbf0);
            setAttributeRowStretch
                      ((DomLayout *)in_stack_fffffffffffffbf0,
                       &in_stack_fffffffffffffbe8->m_attr_name);
            QString::~QString((QString *)0x1add54);
          }
          else {
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                       (size_t)in_stack_fffffffffffffc00);
            QStringView::QStringView<QString,_true>
                      ((QStringView *)in_stack_fffffffffffffc00,
                       (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
            bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffbf0,
                                 (QStringView *)in_stack_fffffffffffffbe8);
            QString::~QString((QString *)0x1addad);
            if (bVar1) {
              QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1addc1);
              QStringView::toString((QStringView *)in_stack_fffffffffffffbf0);
              setAttributeColumnStretch
                        ((DomLayout *)in_stack_fffffffffffffbf0,
                         &in_stack_fffffffffffffbe8->m_attr_name);
              QString::~QString((QString *)0x1ade05);
            }
            else {
              Qt::Literals::StringLiterals::operator____s
                        ((char16_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                         (size_t)in_stack_fffffffffffffc00);
              QStringView::QStringView<QString,_true>
                        ((QStringView *)in_stack_fffffffffffffc00,
                         (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
              bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffbf0,
                                   (QStringView *)in_stack_fffffffffffffbe8);
              QString::~QString((QString *)0x1ade5e);
              if (bVar1) {
                QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1ade72);
                QStringView::toString((QStringView *)in_stack_fffffffffffffbf0);
                setAttributeRowMinimumHeight
                          ((DomLayout *)in_stack_fffffffffffffbf0,
                           &in_stack_fffffffffffffbe8->m_attr_name);
                QString::~QString((QString *)0x1adeb6);
              }
              else {
                Qt::Literals::StringLiterals::operator____s
                          ((char16_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)
                           ,(size_t)in_stack_fffffffffffffc00);
                QStringView::QStringView<QString,_true>
                          ((QStringView *)in_stack_fffffffffffffc00,
                           (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8))
                ;
                bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffbf0,
                                     (QStringView *)in_stack_fffffffffffffbe8);
                QString::~QString((QString *)0x1adf0f);
                if (bVar1) {
                  QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1adf23);
                  QStringView::toString((QStringView *)in_stack_fffffffffffffbf0);
                  setAttributeColumnMinimumWidth
                            ((DomLayout *)in_stack_fffffffffffffbf0,
                             &in_stack_fffffffffffffbe8->m_attr_name);
                  QString::~QString((QString *)0x1adf67);
                }
                else {
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                             (size_t)in_stack_fffffffffffffbf0);
                  ::operator+((QLatin1String *)in_stack_fffffffffffffbf0,
                              (QStringView *)in_stack_fffffffffffffbe8);
                  ::QStringBuilder::operator_cast_to_QString
                            ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                             in_stack_fffffffffffffbe8);
                  QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
                  QString::~QString((QString *)0x1adfe8);
                }
              }
            }
          }
        }
      }
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1ae009);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001ae380;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                 (size_t)in_stack_fffffffffffffc00);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffc00,
                 (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
      sVar4 = 0;
      other.m_data._0_4_ = in_stack_fffffffffffffc18;
      other.m_size = (qsizetype)in_stack_fffffffffffffc10;
      other.m_data._4_4_ = iVar2;
      iVar3 = QStringView::compare((QStringView *)in_stack_fffffffffffffbe8,other,CaseInsensitive);
      in_stack_fffffffffffffc18 = CONCAT13(iVar3 != 0,(int3)in_stack_fffffffffffffc18) ^ 0xff000000;
      QString::~QString((QString *)0x1ae0e1);
      if ((in_stack_fffffffffffffc18 & 0x1000000) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                   (size_t)in_stack_fffffffffffffc00);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffc00,
                   (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        sVar4 = 0;
        other_00.m_data._0_4_ = in_stack_fffffffffffffc18;
        other_00.m_size = (qsizetype)in_stack_fffffffffffffc10;
        other_00.m_data._4_4_ = iVar2;
        iVar3 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffffbe8,other_00,CaseInsensitive);
        in_stack_fffffffffffffc0f = iVar3 != 0 ^ 0xff;
        QString::~QString((QString *)0x1ae1b0);
        if ((in_stack_fffffffffffffc0f & 1) == 0) {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08),
                     (size_t)in_stack_fffffffffffffc00);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffffc00,
                     (QString *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
          sVar4 = 0;
          other_01.m_data._0_4_ = in_stack_fffffffffffffc18;
          other_01.m_size = (qsizetype)in_stack_fffffffffffffc10;
          other_01.m_data._4_4_ = iVar2;
          iVar2 = QStringView::compare
                            ((QStringView *)in_stack_fffffffffffffbe8,other_01,CaseInsensitive);
          in_stack_fffffffffffffbff = iVar2 != 0 ^ 0xff;
          QString::~QString((QString *)0x1ae27f);
          if ((in_stack_fffffffffffffbff & 1) == 0) {
            in_stack_fffffffffffffbe8 = (parameter_type)CONCAT44(in_register_00000034,__fd);
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                       (size_t)in_stack_fffffffffffffbf0);
            ::operator+((QLatin1String *)in_stack_fffffffffffffbf0,
                        (QStringView *)in_stack_fffffffffffffbe8);
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                       in_stack_fffffffffffffbe8);
            QXmlStreamReader::raiseError(&in_stack_fffffffffffffbe8->m_attr_name);
            QString::~QString((QString *)0x1ae365);
          }
          else {
            in_stack_fffffffffffffbf0 = (DomProperty *)operator_new(0x58);
            memset(in_stack_fffffffffffffbf0,0,0x58);
            DomLayoutItem::DomLayoutItem((DomLayoutItem *)in_stack_fffffffffffffbf0);
            DomLayoutItem::read((DomLayoutItem *)in_stack_fffffffffffffbf0,__fd,__buf_02,sVar4);
            QList<DomLayoutItem_*>::append
                      ((QList<DomLayoutItem_*> *)0x1ae2e3,(parameter_type)in_stack_fffffffffffffbe8)
            ;
          }
        }
        else {
          in_stack_fffffffffffffc00 = (DomProperty *)operator_new(0x178);
          memset(in_stack_fffffffffffffc00,0,0x178);
          DomProperty::DomProperty(in_stack_fffffffffffffbf0);
          DomProperty::read(in_stack_fffffffffffffc00,__fd,__buf_01,sVar4);
          QList<DomProperty_*>::append((QList<DomProperty_*> *)0x1ae214,in_stack_fffffffffffffbe8);
        }
      }
      else {
        in_stack_fffffffffffffc10 = (DomProperty *)operator_new(0x178);
        memset(in_stack_fffffffffffffc10,0,0x178);
        DomProperty::DomProperty(in_stack_fffffffffffffbf0);
        DomProperty::read(in_stack_fffffffffffffc10,__fd,__buf_00,sVar4);
        QList<DomProperty_*>::append((QList<DomProperty_*> *)0x1ae145,in_stack_fffffffffffffbe8);
      }
    }
  } while (iVar2 != 5);
LAB_001ae380:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1ae38d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomLayout::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"class"_s) {
            setAttributeClass(attribute.value().toString());
            continue;
        }
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        if (name == u"stretch"_s) {
            setAttributeStretch(attribute.value().toString());
            continue;
        }
        if (name == u"rowstretch"_s) {
            setAttributeRowStretch(attribute.value().toString());
            continue;
        }
        if (name == u"columnstretch"_s) {
            setAttributeColumnStretch(attribute.value().toString());
            continue;
        }
        if (name == u"rowminimumheight"_s) {
            setAttributeRowMinimumHeight(attribute.value().toString());
            continue;
        }
        if (name == u"columnminimumwidth"_s) {
            setAttributeColumnMinimumWidth(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            if (!tag.compare(u"item"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayoutItem();
                v->read(reader);
                m_item.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}